

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtree.c
# Opt level: O2

uint32 cnt_twig(dtree_node_t *node)

{
  dtree_node_t *node_00;
  uint32 uVar1;
  dtree_node_t *pdVar2;
  int iVar3;
  int iVar4;
  
  iVar4 = 0;
  iVar3 = 1;
LAB_00115fb2:
  do {
    pdVar2 = node;
    node_00 = pdVar2->y;
    if ((node_00 == (dtree_node_t *)0x0) && (pdVar2->n == (dtree_node_str *)0x0)) {
      iVar3 = 0;
LAB_0011601d:
      return iVar3 + iVar4;
    }
    if ((node_00->y == (dtree_node_str *)0x0) && (node_00->n == (dtree_node_str *)0x0)) {
      if ((pdVar2->n->y != (dtree_node_str *)0x0) || (pdVar2->n->n != (dtree_node_str *)0x0)) break;
      goto LAB_0011601d;
    }
    if ((pdVar2->n->y != (dtree_node_str *)0x0) ||
       (node = node_00, pdVar2->n->n != (dtree_node_str *)0x0)) goto LAB_00115fe8;
  } while( true );
  node = pdVar2->n;
  if ((node->y == (dtree_node_str *)0x0) && (node->n == (dtree_node_str *)0x0)) {
LAB_00115fe8:
    uVar1 = cnt_twig(node_00);
    iVar4 = iVar4 + uVar1;
    node = pdVar2->n;
  }
  goto LAB_00115fb2;
}

Assistant:

uint32
cnt_twig(dtree_node_t *node)
{
    if (IS_LEAF(node)) {
	return 0;
    } else if (IS_LEAF(node->y) && IS_LEAF(node->n)) {
	return 1;
    }
    else {
	if (IS_LEAF(node->y) && !IS_LEAF(node->n)) {
	    return cnt_twig(node->n);
	}
	else if (!IS_LEAF(node->y) && IS_LEAF(node->n)) {
	    return cnt_twig(node->y);
	}
	else 
	    return cnt_twig(node->y) + cnt_twig(node->n);
    }
}